

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderIsValid(xmlTextReaderPtr reader)

{
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = 0xffffffff;
  }
  else if (reader->validate == XML_TEXTREADER_VALIDATE_RNG) {
    reader_local._4_4_ = (uint)(reader->rngValidErrors == 0);
  }
  else if (reader->validate == XML_TEXTREADER_VALIDATE_XSD) {
    reader_local._4_4_ = (uint)(reader->xsdValidErrors == 0);
  }
  else if ((reader->ctxt == (xmlParserCtxtPtr)0x0) || (reader->ctxt->validate != 1)) {
    reader_local._4_4_ = 0;
  }
  else {
    reader_local._4_4_ = reader->ctxt->valid;
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderIsValid(xmlTextReaderPtr reader)
{
    if (reader == NULL)
        return (-1);
#ifdef LIBXML_RELAXNG_ENABLED
    if (reader->validate == XML_TEXTREADER_VALIDATE_RNG)
        return (reader->rngValidErrors == 0);
#endif
#ifdef LIBXML_SCHEMAS_ENABLED
    if (reader->validate == XML_TEXTREADER_VALIDATE_XSD)
        return (reader->xsdValidErrors == 0);
#endif
    if ((reader->ctxt != NULL) && (reader->ctxt->validate == 1))
        return (reader->ctxt->valid);
    return (0);
}